

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint HuffmanTree_makeFromLengths(HuffmanTree *tree,uint *bitlen,size_t numcodes,uint maxbitlen)

{
  uint *puVar1;
  uint local_30;
  uint i;
  uint maxbitlen_local;
  size_t numcodes_local;
  uint *bitlen_local;
  HuffmanTree *tree_local;
  
  puVar1 = (uint *)lodepng_malloc(numcodes << 2);
  tree->lengths = puVar1;
  if (tree->lengths == (uint *)0x0) {
    tree_local._4_4_ = 0x53;
  }
  else {
    for (local_30 = 0; local_30 != numcodes; local_30 = local_30 + 1) {
      tree->lengths[local_30] = bitlen[local_30];
    }
    tree->numcodes = (uint)numcodes;
    tree->maxbitlen = maxbitlen;
    tree_local._4_4_ = HuffmanTree_makeFromLengths2(tree);
  }
  return tree_local._4_4_;
}

Assistant:

static unsigned HuffmanTree_makeFromLengths(HuffmanTree* tree, const unsigned* bitlen,
                                            size_t numcodes, unsigned maxbitlen) {
  unsigned i;
  tree->lengths = (unsigned*)lodepng_malloc(numcodes * sizeof(unsigned));
  if(!tree->lengths) return 83; /*alloc fail*/
  for(i = 0; i != numcodes; ++i) tree->lengths[i] = bitlen[i];
  tree->numcodes = (unsigned)numcodes; /*number of symbols*/
  tree->maxbitlen = maxbitlen;
  return HuffmanTree_makeFromLengths2(tree);
}